

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O0

Value * soul::generateWaveform
                  (Value *__return_storage_ptr__,double frequency,double sampleRate,
                  int64_t numFrames,Generator *generator,uint32_t oversamplingFactor)

{
  ChannelArrayView<const_float> source;
  ChannelArrayView<const_float> source_00;
  uint uVar1;
  FrameCount FVar2;
  float *pfVar3;
  EVP_PKEY_CTX *ctx;
  double extraout_XMM0_Qa;
  SampleIterator<float> SVar4;
  BufferView<const_float,_choc::buffer::SeparateChannelLayout> local_d8;
  undefined1 local_c0 [8];
  ChannelArrayBuffer<float> resampledData;
  BufferView<const_float,_choc::buffer::SeparateChannelLayout> local_a0;
  uint local_84;
  float *pfStack_80;
  uint32_t i;
  SampleCount local_78;
  undefined1 local_60 [8];
  SampleIterator<float> dst;
  ChannelArrayBuffer<float> data;
  uint32_t oversamplingFactor_local;
  Generator *generator_local;
  int64_t numFrames_local;
  double sampleRate_local;
  double frequency_local;
  
  if ((((numFrames < 1) || (frequency <= 0.0)) || (sampleRate <= 0.0)) || (0x14996fff < numFrames))
  {
    choc::value::Value::Value(__return_storage_ptr__);
  }
  else {
    generator_local._0_4_ = (FrameCount)numFrames;
    choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::AllocatedBuffer
              ((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)&dst.stride,1,
               (FrameCount)generator_local * oversamplingFactor);
    ctx = (EVP_PKEY_CTX *)0x0;
    SVar4 = choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::getIterator
                      ((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)&dst.stride,0)
    ;
    pfStack_80 = SVar4.sample;
    local_78 = SVar4.stride;
    local_60 = (undefined1  [8])pfStack_80;
    dst.sample._0_4_ = local_78;
    WaveGenerators::Generator::init(generator,ctx);
    local_84 = 0;
    while( true ) {
      uVar1 = local_84;
      FVar2 = choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::
              getNumFrames((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)
                           &dst.stride);
      if (FVar2 <= uVar1) break;
      (*generator->_vptr_Generator[2])();
      pfVar3 = choc::buffer::SampleIterator<float>::operator*((SampleIterator<float> *)local_60);
      *pfVar3 = (float)extraout_XMM0_Qa;
      choc::buffer::SampleIterator<float>::operator++((SampleIterator<float> *)local_60);
      WaveGenerators::Generator::advance(generator);
      local_84 = local_84 + 1;
    }
    if (oversamplingFactor == 1) {
      choc::buffer::AllocatedBuffer::operator_cast_to_BufferView
                (&local_a0,(AllocatedBuffer *)&dst.stride);
      source.data.offset = local_a0.data.offset;
      source.data._12_4_ = local_a0.data._12_4_;
      source.data.channels = local_a0.data.channels;
      source.size = local_a0.size;
      convertAudioDataToObject(__return_storage_ptr__,source,sampleRate);
      resampledData.view.size.numFrames = 1;
    }
    else {
      choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::AllocatedBuffer
                ((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)local_c0,1,
                 (FrameCount)generator_local);
      resampleToFit<choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>&,choc::buffer::AllocatedBuffer<float,choc::buffer::SeparateChannelLayout>>
                ((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)local_c0,
                 (AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)&dst.stride,0x32);
      choc::buffer::AllocatedBuffer::operator_cast_to_BufferView
                (&local_d8,(AllocatedBuffer *)local_c0);
      source_00.data.offset = local_d8.data.offset;
      source_00.data._12_4_ = local_d8.data._12_4_;
      source_00.data.channels = local_d8.data.channels;
      source_00.size = local_d8.size;
      convertAudioDataToObject(__return_storage_ptr__,source_00,sampleRate);
      resampledData.view.size.numFrames = 1;
      choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::~AllocatedBuffer
                ((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)local_c0);
    }
    choc::buffer::AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout>::~AllocatedBuffer
              ((AllocatedBuffer<float,_choc::buffer::SeparateChannelLayout> *)&dst.stride);
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value generateWaveform (double frequency, double sampleRate, int64_t numFrames,
                                     WaveGenerators::Generator& generator,
                                     uint32_t oversamplingFactor)
{
    if (numFrames > 0 && frequency > 0 && sampleRate > 0 && numFrames < 48000 * 60 * 60 * 2)
    {
        choc::buffer::ChannelArrayBuffer<float> data (1, (uint32_t) (numFrames * oversamplingFactor));
        auto dst = data.getIterator (0);

        generator.init (frequency, sampleRate * oversamplingFactor);

        for (uint32_t i = 0; i < data.getNumFrames(); ++i)
        {
            *dst = (float) generator.getSample();
            ++dst;
            generator.advance();
        }

        if (oversamplingFactor == 1)
            return convertAudioDataToObject (data, sampleRate);

        // Resample to the right size
        choc::buffer::ChannelArrayBuffer<float> resampledData (1, (uint32_t) numFrames);
        resampleToFit (resampledData, data);
        return convertAudioDataToObject (resampledData, sampleRate);
    }

    return {};
}